

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::SingleFailureChecker::~SingleFailureChecker(SingleFailureChecker *this)

{
  ostream *this_00;
  Type TVar1;
  TestPartResultArray *this_01;
  TestPartResult *pTVar2;
  AssertionResult *pAVar3;
  string *value;
  pointer *__ptr;
  int i;
  int index;
  char *pcVar4;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var5;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  AssertionResult local_70;
  AssertionResult gtest_ar;
  string expected;
  
  this_01 = this->results_;
  TVar1 = this->type_;
  pcVar4 = "1 non-fatal failure";
  if (TVar1 == kFatalFailure) {
    pcVar4 = "1 fatal failure";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expected,pcVar4,(allocator<char> *)&local_70);
  Message::Message((Message *)&local_78);
  _Var5._M_head_impl = local_78._M_head_impl;
  value = &this->substr_;
  if ((int)((*(long *)(this_01 + 8) - *(long *)this_01) / 0x70) == 1) {
    pTVar2 = TestPartResultArray::GetTestPartResult(this_01,0);
    if (pTVar2->type_ == TVar1) {
      pcVar4 = strstr((pTVar2->message_)._M_dataplus._M_p,(value->_M_dataplus)._M_p);
      if (pcVar4 != (char *)0x0) {
        gtest_ar.success_ = true;
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        goto LAB_0019753b;
      }
      local_70.success_ = false;
      local_70.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      pAVar3 = AssertionResult::operator<<(&local_70,(char (*) [11])0x1e8fd3);
      pAVar3 = AssertionResult::operator<<(pAVar3,&expected);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [14])" containing \"");
      pAVar3 = AssertionResult::operator<<(pAVar3,value);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [3])0x1e9b16);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [11])"  Actual:\n");
      pAVar3 = AssertionResult::operator<<(pAVar3,pTVar2);
      AssertionResult::AssertionResult(&gtest_ar,pAVar3);
    }
    else {
      local_70.success_ = false;
      local_70.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      pAVar3 = AssertionResult::operator<<(&local_70,(char (*) [11])0x1e8fd3);
      pAVar3 = AssertionResult::operator<<(pAVar3,&expected);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [2])0x1e971e);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [11])"  Actual:\n");
      pAVar3 = AssertionResult::operator<<(pAVar3,pTVar2);
      AssertionResult::AssertionResult(&gtest_ar,pAVar3);
    }
  }
  else {
    this_00 = (ostream *)(local_78._M_head_impl + 0x10);
    std::operator<<(this_00,"Expected: ");
    std::operator<<(this_00,(string *)&expected);
    std::operator<<(this_00,"\n");
    std::operator<<(this_00,"  Actual: ");
    std::ostream::operator<<(this_00,(int)((*(long *)(this_01 + 8) - *(long *)this_01) / 0x70));
    std::operator<<(this_00," failures");
    for (index = 0; index < (int)((*(long *)(this_01 + 8) - *(long *)this_01) / 0x70);
        index = index + 1) {
      std::operator<<((ostream *)(_Var5._M_head_impl + 0x10),"\n");
      pTVar2 = TestPartResultArray::GetTestPartResult(this_01,index);
      _Var5._M_head_impl = local_78._M_head_impl;
      testing::operator<<((ostream *)(local_78._M_head_impl + 0x10),pTVar2);
    }
    local_70.success_ = false;
    local_70.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    pAVar3 = AssertionResult::operator<<(&local_70,(Message *)&local_78);
    AssertionResult::AssertionResult(&gtest_ar,pAVar3);
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&local_70.message_);
LAB_0019753b:
  if (local_78._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_78._M_head_impl + 8))();
  }
  std::__cxx11::string::~string((string *)&expected);
  if (gtest_ar.success_ == false) {
    Message::Message((Message *)&expected);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/src/gtest.cc"
               ,0x416,pcVar4);
    AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&expected);
    AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if (expected._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)expected._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)value);
  return;
}

Assistant:

SingleFailureChecker::~SingleFailureChecker() {
  EXPECT_PRED_FORMAT3(HasOneFailure, *results_, type_, substr_);
}